

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

Fl_Shared_Image * Fl_Shared_Image::find(char *name,int W,int H)

{
  Fl_Shared_Image *pFVar1;
  size_t sVar2;
  long *plVar3;
  Fl_Shared_Image **match;
  Fl_Shared_Image *key;
  int H_local;
  int W_local;
  char *name_local;
  
  if (num_images_ != 0) {
    key._0_4_ = H;
    key._4_4_ = W;
    _H_local = name;
    pFVar1 = (Fl_Shared_Image *)operator_new(0x48);
    Fl_Shared_Image(pFVar1);
    match = (Fl_Shared_Image **)pFVar1;
    sVar2 = strlen(_H_local);
    pFVar1 = (Fl_Shared_Image *)operator_new__(sVar2 + 1);
    match[5] = pFVar1;
    strcpy((char *)match[5],_H_local);
    Fl_Image::w((Fl_Image *)match,key._4_4_);
    Fl_Image::h((Fl_Image *)match,(int)key);
    plVar3 = (long *)bsearch(&match,images_,(long)num_images_,8,compare);
    if (match != (Fl_Shared_Image **)0x0) {
      (**(code **)&((*match)->super_Fl_Image).w_)();
    }
    if (plVar3 != (long *)0x0) {
      *(int *)(*plVar3 + 0x34) = *(int *)(*plVar3 + 0x34) + 1;
      return (Fl_Shared_Image *)*plVar3;
    }
  }
  return (Fl_Shared_Image *)0x0;
}

Assistant:

Fl_Shared_Image* Fl_Shared_Image::find(const char *name, int W, int H) {
  Fl_Shared_Image	*key,		// Image key
			**match;	// Matching image

  if (num_images_) {
    key = new Fl_Shared_Image();
    key->name_ = new char[strlen(name) + 1];
    strcpy((char *)key->name_, name);
    key->w(W);
    key->h(H);

    match = (Fl_Shared_Image **)bsearch(&key, images_, num_images_,
                                        sizeof(Fl_Shared_Image *),
                                        (compare_func_t)compare);

    delete key;

    if (match) {
      (*match)->refcount_ ++;
      return *match;
    }
  }

  return 0;
}